

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_gears.c
# Opt level: O2

void gl_gears_draw(gears_t *gears,float view_tz,float view_rx,float view_ry,float model_rz)

{
  float blue [4];
  float green [4];
  float red [4];
  
  red[0] = 0.8;
  red[1] = 0.1;
  red[2] = 0.0;
  red[3] = 1.0;
  green[0] = 0.0;
  green[1] = 0.8;
  green[2] = 0.2;
  green[3] = 1.0;
  blue[0] = 0.2;
  blue[1] = 0.2;
  blue[2] = 1.0;
  blue[3] = 1.0;
  if (gears != (gears_t *)0x0) {
    glClear(0x4100);
    glLoadIdentity();
    glTranslatef(0,0,view_tz);
    glRotatef(view_rx,0x3f800000,0,0);
    glRotatef(view_ry,0,0x3f800000,0);
    draw_gear(gears,0,-3.0,-2.0,model_rz,red);
    draw_gear(gears,1,3.1,-2.0,model_rz * -2.0 + -9.0,green);
    draw_gear(gears,2,-3.1,4.2,model_rz * -2.0 + -25.0,blue);
  }
  return;
}

Assistant:

static void gl_gears_draw(gears_t *gears, float view_tz, float view_rx, float view_ry, float model_rz)
{
  const float red[4] = { 0.8, 0.1, 0.0, 1.0 };
  const float green[4] = { 0.0, 0.8, 0.2, 1.0 };
  const float blue[4] = { 0.2, 0.2, 1.0, 1.0 };

  if (!gears) {
    return;
  }

  glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

  glLoadIdentity();
  glTranslatef(0, 0, view_tz);
  glRotatef(view_rx, 1, 0, 0);
  glRotatef(view_ry, 0, 1, 0);

  draw_gear(gears, GEAR0, -3.0, -2.0,      model_rz     , red);
  draw_gear(gears, GEAR1,  3.1, -2.0, -2 * model_rz - 9 , green);
  draw_gear(gears, GEAR2, -3.1,  4.2, -2 * model_rz - 25, blue);
}